

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_relation.cpp
# Opt level: O3

string * __thiscall
duckdb::ViewRelation::GetAlias_abi_cxx11_(string *__return_storage_ptr__,ViewRelation *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->view_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->view_name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string ViewRelation::GetAlias() {
	D_ASSERT(!view_name.empty());
	return view_name;
}